

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O2

void x86_64_ploadi(dill_stream s,int type,int junk,int dest,int src,long offset)

{
  char **ppcVar1;
  void *pvVar2;
  uint rex;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint insn1;
  uint uVar6;
  private_ctx pdVar7;
  int iVar8;
  char *pcVar9;
  int junk_00;
  int junk_01;
  long lVar10;
  uint uVar11;
  uint dest_00;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int local_48;
  
  insn1 = (uint)ld_opcodes[type];
  pdVar7 = s->p;
  pvVar2 = pdVar7->mach_info;
  local_48 = 0;
  bVar3 = true;
  lVar10 = offset;
  dest_00 = dest;
  bVar4 = true;
  switch((ulong)(uint)type) {
  case 0:
  case 1:
    if (3 < dest) {
      dest_00 = 0;
    }
    if (type == 1) {
      local_48 = 0;
      if (dest_00 == src) {
        dest_00 = 0;
      }
      x86_64_clear(s,dest_00);
    }
    else {
      local_48 = 0;
    }
    break;
  case 3:
    dest_00 = 0;
    if (src != dest) {
      dest_00 = dest;
    }
    x86_64_clear(s,dest_00);
    pdVar7 = s->p;
  case 2:
    pcVar9 = pdVar7->cur_ip;
    if (pdVar7->code_limit <= pcVar9) {
      extend_dill_stream(s);
      pcVar9 = s->p->cur_ip;
    }
    *pcVar9 = 'f';
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    break;
  default:
    goto switchD_001169f2_caseD_4;
  case 9:
    local_48 = 0xf3;
    goto LAB_00116a8f;
  case 10:
    local_48 = 0xf2;
LAB_00116a8f:
    bVar4 = false;
switchD_001169f2_caseD_4:
    bVar3 = bVar4;
  }
  iVar8 = (int)lVar10;
  uVar11 = (uint)(type - 6U < 3) * 8;
  cVar5 = *(char *)((long)pvVar2 + 0x34);
  if (cVar5 != '\0') {
    pcVar9 = s->p->cur_ip;
    if (s->p->code_limit <= pcVar9) {
      extend_dill_stream(s);
      cVar5 = *(char *)((long)pvVar2 + 0x34);
      pcVar9 = s->p->cur_ip;
    }
    *pcVar9 = cVar5;
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    *(undefined1 *)((long)pvVar2 + 0x34) = 0;
  }
  rex = uVar11 + 4 + (uint)(7 < src);
  if ((int)dest_00 < 8) {
    rex = uVar11 | 7 < src;
  }
  uVar6 = src & 7;
  uVar11 = (uint)offset;
  if (uVar6 == 4) {
    if ((int)uVar11 != offset) {
LAB_00116bfa:
      if (dest == src) {
        x86_64_arith3i(s,0,6,src,src,offset);
        x86_64_ploadi(s,type,junk_00,src,src,0);
      }
      else {
        x86_64_setl(s,dest,offset);
        x86_64_pload(s,type,junk_01,dest,src,dest);
      }
      goto LAB_00116d7c;
    }
    if (offset != 0) {
      if (offset + 0x7fU < 0xff) {
        if (bVar3) {
          BYTE_OUT4R(s,rex,insn1,(dest_00 & 7) * 8 + 0x44,uVar11 & 0xff,iVar8);
        }
        else {
          BYTE_OUT1R5(s,local_48,rex,0x10,(dest_00 & 7) * 8 + 0x44,uVar11 & 0xff,
                      in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
        }
      }
      else if (bVar3) {
        BYTE_OUT3IR(s,rex,insn1,(dest_00 & 7) * 8 + 0x84,uVar11,iVar8);
      }
      else {
        BYTE_OUT1R4I(s,local_48,rex,0x10,(dest_00 & 7) * 8 + 0x84,uVar11,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffb0);
      }
      goto LAB_00116d7c;
    }
    if (bVar3) {
      iVar8 = (dest_00 & 7) * 8 + 4;
      uVar11 = 0x24;
LAB_00116c94:
      BYTE_OUT3R(s,rex,insn1,iVar8,uVar11);
      goto LAB_00116d7c;
    }
    iVar8 = (dest_00 & 7) * 8 + 4;
    uVar11 = 0x24;
  }
  else {
    if (uVar6 != 5 && offset == 0) {
      if (bVar3) {
        BYTE_OUT2R(s,rex,insn1,uVar6 + (dest_00 & 7) * 8);
      }
      else {
        BYTE_OUT1R3(s,local_48,rex,0x10,uVar6 + (dest_00 & 7) * 8,iVar8);
      }
      goto LAB_00116d7c;
    }
    if (0xfe < offset + 0x7fU) {
      if ((int)uVar11 == offset) {
        if (bVar3) {
          BYTE_OUT2IR(s,rex,insn1,uVar6 + (dest_00 & 7) * 8 + 0x80,uVar11);
        }
        else {
          BYTE_OUT1R3I(s,local_48,rex,0x10,uVar6 + (dest_00 & 7) * 8 + 0x80,uVar11,
                       in_stack_ffffffffffffffa8);
        }
        goto LAB_00116d7c;
      }
      goto LAB_00116bfa;
    }
    if (bVar3) {
      iVar8 = uVar6 + (dest_00 & 7) * 8 + 0x40;
      uVar11 = uVar11 & 0xff;
      goto LAB_00116c94;
    }
    iVar8 = uVar6 + (dest_00 & 7) * 8 + 0x40;
    uVar11 = uVar11 & 0xff;
  }
  BYTE_OUT1R4(s,local_48,rex,0x10,iVar8,uVar11,in_stack_ffffffffffffffa8);
LAB_00116d7c:
  if ((uint)type < 4) {
    (*(code *)(&DAT_0011d1ec + *(int *)(&DAT_0011d1ec + (ulong)(uint)type * 4)))();
    return;
  }
  return;
}

Assistant:

extern void
x86_64_ploadi(dill_stream s,
              int type,
              int junk,
              int dest,
              int src,
              IMM_TYPE offset)
{
    unsigned char opcode = ld_opcodes[type];
    int tmp_dest = dest;
    x86_64_mach_info smi = (x86_64_mach_info)s->p->mach_info;
    int rex = 0;
    int float_op = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P)) {
        rex = REX_W;
    }
    switch (type) {
    case DILL_F:
        float_op = 0xf3;
        break;
    case DILL_D:
        float_op = 0xf2;
        break;
    case DILL_C:
    case DILL_UC:
        if (dest >= ESP) {
            /* movb doesn't work for big regs, load to eax */
            tmp_dest = EAX;
        }
        if (type == DILL_UC) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        break;
    case DILL_S:
    case DILL_US:
        if (type == DILL_US) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        BYTE_OUT1(s, 0x66);
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
    /* fall through */
    default:
        break;
    }
    if (smi->pending_prefix != 0) {
        BYTE_OUT1(s, smi->pending_prefix);
        smi->pending_prefix = 0;
    }
    if (src > RDI)
        rex |= REX_B;
    if (tmp_dest > RDI)
        rex |= REX_R;
    if (((0x7 & src) == RSP) &&
        (((offset & 0xffffffff80000000) == 0) ||
         ((offset & 0xffffffff80000000) == 0xffffffff80000000))) {
        /* must use SIB because ModRM has a discontinuity */
        if (offset == 0) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, 0x4), SIB(0, 4, src));
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x0, tmp_dest, 0x4),
                           SIB(0, 4, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R5(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), SIB(0, ESP, 0x4),
                            offset & 0xff);
            } else {
                BYTE_OUT4R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           SIB(0, ESP, 0x4), offset & 0xff);
            }
        } else {
            if (float_op != 0) {
                BYTE_OUT1R4I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, 0x4), SIB(0, 4, src),
                             (int)offset);
            } else {
                BYTE_OUT3IR(s, rex, opcode, ModRM(0x2, tmp_dest, 0x4),
                            SIB(0, 4, src), (int)offset);
            }
        }
    } else {
        if ((offset == 0) &&
            ((src & 0x7) != 5)) { /* avoid discontinuity in ModRM */
            if (float_op != 0) {
                BYTE_OUT1R3(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, src));
            } else {
                BYTE_OUT2R(s, rex, opcode, ModRM(0x0, tmp_dest, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), offset & 0xff);
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           offset & 0xff);
            }
        } else if (((offset & 0xffffffff80000000) == 0) ||
                   ((offset & 0xffffffff80000000) == 0xffffffff80000000)) {
            if (float_op != 0) {
                BYTE_OUT1R3I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, src), (int)offset);
            } else {
                BYTE_OUT2IR(s, rex, opcode, ModRM(0x2, tmp_dest, src),
                            (int)offset);
            }
        } else {
            /* really big offset */
            if (dest != src) {
                /* use dest since it'll be destroyed by the load */
                x86_64_setl(s, dest, offset);
                x86_64_pload(s, type, 0, dest, src, dest);
            } else {
                /* destroy src, but since it's the same as dest, it's lost
                 * anyway */
                x86_64_arith3i(s, 0, DILL_L, src, src, offset);
                x86_64_ploadi(s, type, 0, dest, src, 0);
            }
        }
    }
    switch (type) {
    case DILL_C:
        x86_64_lshi(s, dest, tmp_dest, 56);
        x86_64_rshai(s, dest, dest, 56);
        break;
    case DILL_S:
        x86_64_lshi(s, dest, tmp_dest, 48);
        x86_64_rshai(s, dest, dest, 48);
        break;
    case DILL_UC:
    case DILL_US:
        if (dest != tmp_dest)
            x86_64_movi(s, dest, tmp_dest);
        break;
    }
}